

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.c
# Opt level: O0

void setup_movable_item(tgestate_t *state,movableitem_t *movableitem,character_t character)

{
  undefined1 in_DL;
  undefined8 *in_RSI;
  long in_RDI;
  vischar_t *vischar1;
  vischar_t *in_stack_ffffffffffffffd8;
  
  *(undefined1 *)&((tgestate_t *)(in_RDI + 0x400))->width = in_DL;
  *(undefined8 *)(in_RDI + 0x420) = *in_RSI;
  *(undefined8 *)(in_RDI + 0x428) = in_RSI[1];
  *(undefined8 *)(in_RDI + 0x430) = in_RSI[2];
  *(undefined1 *)(in_RDI + 0x401) = 0;
  *(undefined1 *)(in_RDI + 0x402) = 0;
  *(undefined1 *)(in_RDI + 0x403) = 0;
  *(undefined1 *)(in_RDI + 0x404) = 0;
  *(undefined1 *)(in_RDI + 0x405) = 0;
  *(undefined1 *)(in_RDI + 0x406) = 0;
  *(undefined1 *)(in_RDI + 0x407) = 0;
  *(anim_t ***)(in_RDI + 0x408) = animations;
  *(anim_t **)(in_RDI + 0x410) = animations[8];
  *(undefined1 *)(in_RDI + 0x418) = 0;
  *(undefined1 *)(in_RDI + 0x419) = 0;
  *(undefined1 *)(in_RDI + 0x41a) = 0;
  *(undefined1 *)(in_RDI + 0x43c) = *(undefined1 *)(in_RDI + 0x120);
  calc_vischar_isopos_from_vischar((tgestate_t *)(in_RDI + 0x400),in_stack_ffffffffffffffd8);
  return;
}

Assistant:

void setup_movable_item(tgestate_t          *state,
                        const movableitem_t *movableitem,
                        character_t          character)
{
  vischar_t *vischar1; /* was HL */

  assert(state       != NULL);
  assert(movableitem != NULL);
  ASSERT_CHARACTER_VALID(character);

  /* The movable item uses the first non-player visible character slot. */
  vischar1 = &state->vischars[1];

  vischar1->character         = character;
  vischar1->mi                = *movableitem;

  /* Conv: Reset data inlined. */

  vischar1->flags             = 0;
  vischar1->route.index       = routeindex_0_HALT;
  vischar1->route.step        = 0;
  vischar1->target.u          = 0;
  vischar1->target.v          = 0;
  vischar1->target.w          = 0;
  vischar1->counter_and_flags = 0;
  vischar1->animbase          = &animations[0];
  vischar1->anim              = animations[8]; /* -> anim_wait_tl animation */
  vischar1->animindex         = 0;
  vischar1->input             = 0;
  vischar1->direction         = direction_TOP_LEFT; /* == 0 */

  vischar1->room              = state->room_index;
  calc_vischar_isopos_from_vischar(state, vischar1);
}